

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Node * prvTidyFindBody(TidyDocImpl *doc)

{
  bool bVar1;
  Node *local_28;
  TidyDocImpl *local_20;
  Node *node;
  TidyDocImpl *doc_local;
  
  if (doc == (TidyDocImpl *)0x0) {
    local_28 = (Node *)0x0;
  }
  else {
    local_28 = (doc->root).content;
  }
  local_20 = (TidyDocImpl *)local_28;
  while( true ) {
    bVar1 = false;
    if (local_20 != (TidyDocImpl *)0x0) {
      bVar1 = false;
      if ((local_20 != (TidyDocImpl *)0x0) &&
         (bVar1 = false, *(Dict **)((long)local_20 + 0x38) != (Dict *)0x0)) {
        bVar1 = (*(Dict **)((long)local_20 + 0x38))->id == TidyTag_HTML;
      }
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (!bVar1) break;
    local_20 = *(TidyDocImpl **)((long)local_20 + 0x10);
  }
  if (local_20 == (TidyDocImpl *)0x0) {
    doc_local = (TidyDocImpl *)0x0;
  }
  else {
    local_20 = *(TidyDocImpl **)((long)local_20 + 0x18);
    while( true ) {
      bVar1 = false;
      if ((local_20 != (TidyDocImpl *)0x0) &&
         (((local_20 == (TidyDocImpl *)0x0 || ((local_20->root).tag == (Dict *)0x0)) ||
          (bVar1 = false, ((local_20->root).tag)->id != TidyTag_BODY)))) {
        bVar1 = false;
        if ((local_20 != (TidyDocImpl *)0x0) && (bVar1 = false, (local_20->root).tag != (Dict *)0x0)
           ) {
          bVar1 = ((local_20->root).tag)->id == TidyTag_FRAMESET;
        }
        bVar1 = (bool)(bVar1 ^ 1);
      }
      if (!bVar1) break;
      local_20 = (TidyDocImpl *)(local_20->root).next;
    }
    if (((local_20 != (TidyDocImpl *)0x0) && (local_20 != (TidyDocImpl *)0x0)) &&
       (((local_20->root).tag != (Dict *)0x0 && (((local_20->root).tag)->id == TidyTag_FRAMESET))))
    {
      local_20 = (TidyDocImpl *)(local_20->root).content;
      while( true ) {
        bVar1 = false;
        if (local_20 != (TidyDocImpl *)0x0) {
          bVar1 = false;
          if ((local_20 != (TidyDocImpl *)0x0) &&
             (bVar1 = false, (local_20->root).tag != (Dict *)0x0)) {
            bVar1 = ((local_20->root).tag)->id == TidyTag_NOFRAMES;
          }
          bVar1 = (bool)(bVar1 ^ 1);
        }
        if (!bVar1) break;
        local_20 = (TidyDocImpl *)(local_20->root).next;
      }
      if (local_20 != (TidyDocImpl *)0x0) {
        local_20 = (TidyDocImpl *)(local_20->root).content;
        while( true ) {
          bVar1 = false;
          if (local_20 != (TidyDocImpl *)0x0) {
            bVar1 = false;
            if ((local_20 != (TidyDocImpl *)0x0) &&
               (bVar1 = false, (local_20->root).tag != (Dict *)0x0)) {
              bVar1 = ((local_20->root).tag)->id == TidyTag_BODY;
            }
            bVar1 = (bool)(bVar1 ^ 1);
          }
          if (!bVar1) break;
          local_20 = (TidyDocImpl *)(local_20->root).next;
        }
      }
    }
    doc_local = local_20;
  }
  return &doc_local->root;
}

Assistant:

Node *TY_(FindBody)( TidyDocImpl* doc )
{
    Node *node = ( doc ? doc->root.content : NULL );

    while ( node && !nodeIsHTML(node) )
        node = node->next;

    if (node == NULL)
        return NULL;

    node = node->content;
    while ( node && !nodeIsBODY(node) && !nodeIsFRAMESET(node) )
        node = node->next;

    if ( node && nodeIsFRAMESET(node) )
    {
        node = node->content;
        while ( node && !nodeIsNOFRAMES(node) )
            node = node->next;

        if ( node )
        {
            node = node->content;
            while ( node && !nodeIsBODY(node) )
                node = node->next;
        }
    }

    return node;
}